

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O2

void test_archive_string_sort(void)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  time_t tVar4;
  char **strings;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  char **ppcVar8;
  
  tVar4 = time((time_t *)0x0);
  srand((uint)tVar4);
  strings = (char **)calloc(1,0xe0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                   ,L'Ɓ',(uint)(strings != (char **)0x0),
                   "(test_strings = (char **)calloc(1, sizeof(strings))) != NULL",(void *)0x0);
  for (lVar6 = 0; lVar6 != 0xd8; lVar6 = lVar6 + 8) {
    pcVar5 = strdup(*(char **)((long)::strings + lVar6));
    *(char **)((long)strings + lVar6) = pcVar5;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                     ,L'ƃ',(uint)(pcVar5 != (char *)0x0),
                     "(test_strings[i] = strdup(strings[i])) != NULL",(void *)0x0);
  }
  lVar6 = 0;
  uVar7 = 0x1b;
  ppcVar8 = strings;
  while (uVar7 != 0) {
    uVar2 = rand();
    uVar1 = (ulong)uVar2 % (uVar7 & 0xffffffff);
    pcVar5 = *ppcVar8;
    *ppcVar8 = strings[lVar6 + uVar1];
    strings[lVar6 + uVar1] = pcVar5;
    lVar6 = lVar6 + 1;
    ppcVar8 = ppcVar8 + 1;
    uVar7 = uVar7 - 1;
  }
  iVar3 = archive_utility_string_sort(strings);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
                      ,L'Ɛ',0,"ARCHIVE_OK",(long)iVar3,"archive_utility_string_sort(test_strings)",
                      (void *)0x0);
  for (lVar6 = 0; lVar6 != 0xd8; lVar6 = lVar6 + 8) {
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string.c"
               ,L'ƒ',*(char **)((long)strings + lVar6),"test_strings[i]",
               *(char **)((long)::strings + lVar6),"strings[i]",(void *)0x0,L'\0');
  }
  for (lVar6 = 0; lVar6 != 0x1b; lVar6 = lVar6 + 1) {
    free(strings[lVar6]);
  }
  free(strings);
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_sort)
{
  unsigned int i, j, size;
  char **test_strings, *tmp;

  srand(time(NULL));
  size = sizeof(strings) / sizeof(char *);
  assert((test_strings = (char **)calloc(1, sizeof(strings))) != NULL);
  for (i = 0; i < (size - 1); i++)
    assert((test_strings[i] = strdup(strings[i])) != NULL);

  /* Shuffle the test strings */
  for (i = 0; i < (size - 1); i++)
  {
    j = rand() % ((size - 1) - i);
    j += i;
    tmp = test_strings[i];
    test_strings[i] = test_strings[j];
    test_strings[j] = tmp;
  }

  /* Sort and test */
  assertEqualInt(ARCHIVE_OK, archive_utility_string_sort(test_strings));
  for (i = 0; i < (size - 1); i++)
    assertEqualString(test_strings[i], strings[i]);

  for (i = 0; i < (size - 1); i++)
    free(test_strings[i]);
  free(test_strings);
}